

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnnoise_demo.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  DenoiseState *st;
  FILE *__stream;
  FILE *__stream_00;
  long lVar2;
  bool bVar3;
  short tmp [480];
  float x [480];
  
  st = rnnoise_create((RNNModel *)0x0);
  if (argc == 3) {
    __stream = fopen(argv[1],"rb");
    __stream_00 = fopen(argv[2],"wb");
    bVar3 = false;
    while( true ) {
      fread(tmp,2,0x1e0,__stream);
      iVar1 = feof(__stream);
      if (iVar1 != 0) break;
      for (lVar2 = 0; lVar2 != 0x1e0; lVar2 = lVar2 + 1) {
        x[lVar2] = (float)(int)tmp[lVar2];
      }
      rnnoise_process_frame(st,x,x);
      for (lVar2 = 0; lVar2 != 0x1e0; lVar2 = lVar2 + 1) {
        tmp[lVar2] = (short)(int)x[lVar2];
      }
      if (bVar3) {
        fwrite(tmp,2,0x1e0,__stream_00);
      }
      bVar3 = true;
    }
    rnnoise_destroy(st);
    fclose(__stream);
    fclose(__stream_00);
    iVar1 = 0;
  }
  else {
    fprintf(_stderr,"usage: %s <noisy speech> <output denoised>\n",*argv);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int main(int argc, char **argv) {
    int i;
    int first = 1; // 标记是否是第一帧pcm
    float x[FRAME_SIZE];
    FILE *f1, *fout;
    DenoiseState *st;
    st = rnnoise_create(NULL);
    if (argc != 3) {
        fprintf(stderr, "usage: %s <noisy speech> <output denoised>\n", argv[0]);
        return 1;
    }
    f1 = fopen(argv[1], "rb");
    fout = fopen(argv[2], "wb");
    while (1) {
        short tmp[FRAME_SIZE];
        fread(tmp, sizeof(short), FRAME_SIZE, f1); // 从文件流中读数据
        if (feof(f1)) break; // 达到文件结尾
        for (i = 0; i < FRAME_SIZE; i++) x[i] = tmp[i];
        rnnoise_process_frame(st, x, x);
        for (i = 0; i < FRAME_SIZE; i++) tmp[i] = x[i];
        if (!first) fwrite(tmp, sizeof(short), FRAME_SIZE, fout);
        // 第一帧不处理不保存, 从第二帧开始保存, out文件自然会少一帧, 但不影响PESQ的测试
        // 一帧480个采样点,每个采样点short类型的2字节，少的一帧就是960字节
        first = 0;
    }
    rnnoise_destroy(st);
    fclose(f1);
    fclose(fout);
    return 0;
}